

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O0

void satellite_info_cleanup(satellite_info *info)

{
  int local_14;
  int i;
  satellite_info *info_local;
  
  if (info->observable != (char **)0x0) {
    for (local_14 = 0; local_14 < info->num_observables; local_14 = local_14 + 1) {
      if (info->observable[local_14] != (char *)0x0) {
        free(info->observable[local_14]);
      }
    }
    free(info->observable);
  }
  if (info->sat_obs_definition != (coda_type_record *)0x0) {
    coda_type_release((coda_type *)info->sat_obs_definition);
  }
  if (info->sat_obs_array_definition != (coda_type_array *)0x0) {
    coda_type_release((coda_type *)info->sat_obs_array_definition);
  }
  if (info->sat_obs_array != (coda_mem_array *)0x0) {
    coda_dynamic_type_delete((coda_dynamic_type *)info->sat_obs_array);
  }
  if (info->records != (coda_mem_array *)0x0) {
    coda_dynamic_type_delete((coda_dynamic_type *)info->records);
  }
  return;
}

Assistant:

static void satellite_info_cleanup(satellite_info *info)
{
    int i;

    if (info->observable != NULL)
    {
        for (i = 0; i < info->num_observables; i++)
        {
            if (info->observable[i] != NULL)
            {
                free(info->observable[i]);
            }
        }
        free(info->observable);
    }
    if (info->sat_obs_definition != NULL)
    {
        coda_type_release((coda_type *)info->sat_obs_definition);
    }
    if (info->sat_obs_array_definition != NULL)
    {
        coda_type_release((coda_type *)info->sat_obs_array_definition);
    }
    if (info->sat_obs_array != NULL)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)info->sat_obs_array);
    }
    if (info->records != NULL)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)info->records);
    }
}